

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::GetGeneratorDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  pointer ppcVar1;
  cmExternalMakefileProjectGeneratorFactory *this_00;
  pointer pbVar2;
  pointer ppcVar3;
  cmDocumentationEntry e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generators;
  string doc;
  string name;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  cmake *local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  for (ppcVar3 = (this->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar3 !=
      (this->Generators).
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    local_f0._0_8_ = local_f0 + 0x10;
    local_f0._8_8_ = 0;
    local_f0[0x10] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[3])(*ppcVar3,(cmDocumentationEntry *)local_f0);
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
              (v,(cmDocumentationEntry *)local_f0);
    cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_f0);
  }
  local_b0 = this;
  for (ppcVar1 = (this->ExtraGenerators).
                 super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppcVar1 !=
      (local_b0->ExtraGenerators).
      super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
    cmExternalMakefileProjectGeneratorFactory::GetDocumentation_abi_cxx11_(&local_90,*ppcVar1);
    cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&local_70,*ppcVar1);
    this_00 = *ppcVar1;
    for (pbVar2 = (this_00->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != (this_00->Aliases).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      local_f0._0_8_ = local_f0 + 0x10;
      local_f0._8_8_ = 0;
      local_f0[0x10] = '\0';
      local_d0._M_p = (pointer)&local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)local_f0);
      std::__cxx11::string::_M_assign((string *)&local_d0);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                (v,(cmDocumentationEntry *)local_f0);
      cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_f0);
      this_00 = *ppcVar1;
    }
    cmExternalMakefileProjectGeneratorFactory::GetSupportedGlobalGenerators_abi_cxx11_
              (&local_a8,this_00);
    for (pbVar2 = local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      local_f0._0_8_ = local_f0 + 0x10;
      local_f0._8_8_ = 0;
      local_f0[0x10] = '\0';
      local_d0._M_p = (pointer)&local_c0;
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,pbVar2,&local_70);
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::_M_assign((string *)&local_d0);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::push_back
                (v,(cmDocumentationEntry *)local_f0);
      cmDocumentationEntry::~cmDocumentationEntry((cmDocumentationEntry *)local_f0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void cmake::GetGeneratorDocumentation(std::vector<cmDocumentationEntry>& v)
{
  for (RegisteredGeneratorsVector::const_iterator i = this->Generators.begin();
       i != this->Generators.end(); ++i) {
    cmDocumentationEntry e;
    (*i)->GetDocumentation(e);
    v.push_back(e);
  }
  for (RegisteredExtraGeneratorsVector::const_iterator i =
         this->ExtraGenerators.begin();
       i != this->ExtraGenerators.end(); ++i) {
    const std::string doc = (*i)->GetDocumentation();
    const std::string name = (*i)->GetName();

    // Aliases:
    for (std::vector<std::string>::const_iterator a = (*i)->Aliases.begin();
         a != (*i)->Aliases.end(); ++a) {
      cmDocumentationEntry e;
      e.Name = *a;
      e.Brief = doc;
      v.push_back(e);
    }

    // Full names:
    const std::vector<std::string> generators =
      (*i)->GetSupportedGlobalGenerators();
    for (std::vector<std::string>::const_iterator g = generators.begin();
         g != generators.end(); ++g) {
      cmDocumentationEntry e;
      e.Name =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(*g, name);
      e.Brief = doc;
      v.push_back(e);
    }
  }
}